

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getNode(LLVMDataDependenceAnalysis *this,Value *val)

{
  iterator iVar1;
  RWNode *pRVar2;
  Value *local_8;
  
  local_8 = val;
  iVar1 = std::
          _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(this + 0xb0) + 0x48),&local_8);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pRVar2 = (RWNode *)0x0;
  }
  else {
    pRVar2 = *(RWNode **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_false>
                     ._M_cur + 0x28);
  }
  return pRVar2;
}

Assistant:

RWNode *LLVMDataDependenceAnalysis::getNode(const llvm::Value *val) {
    return builder->getNode(val);
}